

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::PrimToPrimSpecImpl<tinyusdz::Xform>(Xform *p,PrimSpec *ps,string *err)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> toks;
  Attribute xformOpOrderAttr;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_8d8;
  Attribute local_8b8;
  Property local_610;
  
  ::std::__cxx11::string::_M_assign((string *)&ps->_name);
  ps->_specifier = (p->super_GPrim).spec;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=(&(ps->_props)._M_t,&(p->super_GPrim).props._M_t);
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Attribute::Attribute(&local_8b8);
  Attribute::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_8b8,&local_8d8);
  Property::Property(&local_610,&local_8b8,false);
  ::std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::_M_emplace_unique<char_const(&)[13],tinyusdz::Property>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Property>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Property>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)&ps->_props,(char (*) [13])"xformOpOrder",&local_610);
  Property::~Property(&local_610);
  PrimMetas::operator=(&ps->_metas,&(p->super_GPrim).meta);
  Attribute::~Attribute(&local_8b8);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_8d8);
  return true;
}

Assistant:

bool PrimToPrimSpecImpl(const Xform &p, PrimSpec &ps, std::string *err) {
  (void)err;

  ps.name() = p.name;
  ps.specifier() = p.spec;

  ps.props() = p.props;

  // TODO..
  std::vector<value::token> toks;
  Attribute xformOpOrderAttr;
  xformOpOrderAttr.set_value(toks);
  ps.props().emplace("xformOpOrder",
                     Property(xformOpOrderAttr, /* custom */ false));

  ps.metas() = p.meta;

  // TODO: variantSet
  // ps.variantSets

  return true;
}